

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

format_decimal_result<char_*>
fmt::v9::detail::format_decimal<char,unsigned_int>(char *out,uint value,int size)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  format_decimal_result<char_*> fVar4;
  
  pcVar1 = out + size;
  uVar2 = (ulong)value;
  while( true ) {
    pcVar3 = pcVar1 + -2;
    if ((uint)uVar2 < 100) break;
    *(undefined2 *)pcVar3 =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + (uVar2 % 100) * 2);
    pcVar1 = pcVar3;
    uVar2 = uVar2 / 100;
  }
  if ((uint)uVar2 < 10) {
    pcVar1[-1] = (byte)uVar2 | 0x30;
    pcVar3 = pcVar1 + -1;
  }
  else {
    *(undefined2 *)pcVar3 =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + uVar2 * 2);
  }
  fVar4.end = out + size;
  fVar4.begin = pcVar3;
  return fVar4;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}